

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuickSort.c
# Opt level: O1

void QuickSort(int *sort,int start,int end)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  int iVar5;
  
  do {
    if (end <= start) {
      return;
    }
    iVar1 = sort[start];
    uVar3 = (ulong)(uint)end;
    iVar5 = start;
    do {
      uVar3 = (ulong)(int)uVar3;
      do {
        if (sort[uVar3] < iVar1) {
          sort[iVar5] = sort[uVar3];
          iVar5 = iVar5 + 1;
          break;
        }
        uVar3 = uVar3 - 1;
      } while ((long)iVar5 < (long)uVar3);
      iVar2 = (int)uVar3;
      if (iVar5 < iVar2) {
        piVar4 = sort + iVar5;
        do {
          if (iVar1 <= *piVar4) {
            sort[iVar2] = *piVar4;
            uVar3 = (ulong)(iVar2 - 1);
            break;
          }
          iVar5 = iVar5 + 1;
          piVar4 = piVar4 + 1;
        } while (iVar2 != iVar5);
      }
    } while (iVar5 < (int)uVar3);
    sort[iVar5] = iVar1;
    QuickSort(sort,start,iVar5 + -1);
    start = iVar5 + 1;
  } while( true );
}

Assistant:

void QuickSort(int sort[],int start,int end){
    if(start >= end)
        return;
    int i = start;
    int j = end;
    int baseval = sort[start];
    while(i < j){
        //从右往左找比基准数小的数
        while(i < j && sort[j] >= baseval){
            j--;
        }
        if(i < j){      //交换
            sort[i] = sort[j];
            i++;        //减少一次寻找比基准数大的数
        }
        //从左往右找比基准数大的数
        while(i < j && sort[i] < baseval){
            i++;
        }
        if(i < j){      //交换
            sort[j] = sort[i];
            j--;    //减少一次寻找比基准数小的数
        }
    }
    //把基准数放到i的位置
    sort[i] = baseval;
    //递归
    QuickSort(sort,start,i - 1);  //快速排序基准数之前的
    QuickSort(sort,i + 1,end);    //快速排序基准数之后的
}